

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri_encode.cpp
# Opt level: O3

string * cmakels::support::uri_to_filename(string *__return_storage_ptr__,string *uri)

{
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)uri);
  return __return_storage_ptr__;
}

Assistant:

std::string uri_to_filename(std::string const &uri) {
#ifdef _WIN32
  auto str = uri.substr(8, std::string::npos);
  std::replace(str.begin(), str.end(), '/', '\\');
  support::replace_all(str, "%3A", ":");
  return str;
#else
  return uri.substr(7, std::string::npos);
#endif
}